

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.hpp
# Opt level: O0

size_t __thiscall helics::BrokerBase::currentMessageCounter(BrokerBase *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(acquire,__memory_order_mask);
  return *(size_t *)(in_RDI + 0xe0);
}

Assistant:

std::size_t currentMessageCounter() const
    {
        return messageCounter.load(std::memory_order_acquire);
    }